

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O3

void __thiscall FakeTokenCommandRunner::~FakeTokenCommandRunner(FakeTokenCommandRunner *this)

{
  pointer ppEVar1;
  
  (this->super_CommandRunner)._vptr_CommandRunner =
       (_func_int **)&PTR__FakeTokenCommandRunner_001f74d0;
  std::_Bvector_base<std::allocator<bool>_>::_M_deallocate
            (&(this->wait_for_command_).super__Bvector_base<std::allocator<bool>_>);
  std::_Bvector_base<std::allocator<bool>_>::_M_deallocate
            (&(this->can_run_more_).super__Bvector_base<std::allocator<bool>_>);
  std::_Bvector_base<std::allocator<bool>_>::_M_deallocate
            (&(this->acquire_token_).super__Bvector_base<std::allocator<bool>_>);
  ppEVar1 = (this->edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppEVar1 != (pointer)0x0) {
    operator_delete(ppEVar1,(long)(this->edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppEVar1
                   );
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->commands_ran_);
  operator_delete(this,0xb0);
  return;
}

Assistant:

explicit FakeTokenCommandRunner() {}